

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

bool __thiscall HEkkPrimal::useVariableIn(HEkkPrimal *this)

{
  double dVar1;
  uint uVar2;
  HEkk *pHVar3;
  HEkk *pHVar4;
  bool bVar5;
  bool bVar6;
  reference pvVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  HighsInt HVar10;
  HEkkPrimal *in_RDI;
  string theta_dual_sign;
  string theta_dual_size;
  bool theta_dual_sign_error;
  bool theta_dual_small;
  double computed_theta_dual;
  double updated_theta_dual;
  vector<signed_char,_std::allocator<signed_char>_> *nonbasicMove;
  vector<double,_std::allocator<double>_> *workDual;
  HighsSimplexInfo *info;
  HVector *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  HighsInt iCol;
  HighsLogOptions *format;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint uVar11;
  HighsInt in_stack_ffffffffffffff2c;
  uint uVar12;
  undefined4 uVar13;
  HEkk *in_stack_ffffffffffffff30;
  allocator local_99;
  string local_98 [48];
  double in_stack_ffffffffffffff98;
  double in_stack_ffffffffffffffa0;
  HEkk *in_stack_ffffffffffffffa8;
  double dVar14;
  
  iCol = (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  pHVar3 = in_RDI->ekk_instance_;
  pHVar4 = in_RDI->ekk_instance_;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&(pHVar3->info_).workDual_,(long)in_RDI->variable_in);
  dVar1 = *pvVar7;
  HVar10 = 1;
  if (0.0 < dVar1) {
    HVar10 = -1;
  }
  in_RDI->move_in = HVar10;
  std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
            (&(pHVar4->basis_).nonbasicMove_,(long)in_RDI->variable_in);
  HEkk::pivotColumnFtran
            ((HEkk *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),iCol,
             in_stack_ffffffffffffff10);
  dVar14 = HEkk::computeDualForTableauColumn
                     (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                      (HVector *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  HEkk::debugUpdatedDual
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&(pHVar3->info_).workDual_,(long)in_RDI->variable_in);
  *pvVar7 = dVar14;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&(pHVar3->info_).workDual_,(long)in_RDI->variable_in);
  in_RDI->theta_dual = *pvVar7;
  bVar5 = ABS(in_RDI->theta_dual) <= in_RDI->dual_feasibility_tolerance;
  bVar6 = dVar1 * dVar14 <= 0.0;
  if (bVar5) {
    (in_RDI->ekk_instance_->info_).num_dual_infeasibilities =
         (in_RDI->ekk_instance_->info_).num_dual_infeasibilities + -1;
  }
  else if (!bVar6) {
    return true;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa0,"",(allocator *)&stack0xffffffffffffff9f);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  if (bVar5) {
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffffa0,"; too small");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"",&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  if (bVar6) {
    std::__cxx11::string::operator=(local_98,"; sign error");
  }
  format = &(in_RDI->ekk_instance_->options_->super_HighsOptionsStruct).log_options;
  uVar11 = in_RDI->variable_in;
  uVar2 = in_RDI->ekk_instance_->iteration_count_;
  uVar12 = (pHVar3->info_).update_count;
  uVar8 = std::__cxx11::string::c_str();
  uVar13 = SUB84(dVar14,0);
  uVar9 = std::__cxx11::string::c_str();
  highsLogDev(uVar13,(HighsLogType)dVar1,(char *)format,1,
              "Chosen entering variable %d (Iter = %d; Update = %d) has computed (updated) dual of %10.4g (%10.4g) so don\'t use it%s%s\n"
              ,(ulong)uVar11,(ulong)uVar2,(ulong)uVar12,uVar8,uVar9);
  if ((!bVar5) && (0 < (pHVar3->info_).update_count)) {
    in_RDI->rebuild_reason = 7;
  }
  hyperChooseColumnClear(in_RDI);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  return false;
}

Assistant:

bool HEkkPrimal::useVariableIn() {
  // rebuild_reason = kRebuildReasonPossiblySingularBasis is set if
  // numerical trouble is detected
  HighsSimplexInfo& info = ekk_instance_.info_;
  vector<double>& workDual = info.workDual_;
  const vector<int8_t>& nonbasicMove = ekk_instance_.basis_.nonbasicMove_;
  const double updated_theta_dual = workDual[variable_in];
  // Determine the move direction - can't use nonbasicMove_[variable_in]
  // due to free columns
  move_in = updated_theta_dual > 0 ? -1 : 1;
  // Unless the variable is free, nonbasicMove[variable_in] should be the same
  // as move_in
  if (nonbasicMove[variable_in]) assert(nonbasicMove[variable_in] == move_in);
  //
  // FTRAN
  //
  // Compute pivot column
  ekk_instance_.pivotColumnFtran(variable_in, col_aq);
  // Compute the dual for the pivot column and compare it with the
  // updated value
  double computed_theta_dual =
      ekk_instance_.computeDualForTableauColumn(variable_in, col_aq);
  ekk_instance_.debugUpdatedDual(updated_theta_dual, computed_theta_dual);
  // Feed in the computed dual value.
  //
  // The sum of dual infeasibilities (and maybe max dual
  // infeasibility) will be wrong, but there's a big tolerance on
  // this in debugSimplex. Have to be careful (below) if the computed
  // dual value is no longer a dual infeasibility
  info.workDual_[variable_in] = computed_theta_dual;
  // Reassign theta_dual to be the computed value
  theta_dual = info.workDual_[variable_in];
  // Determine whether theta_dual is too small or has changed sign
  const bool theta_dual_small = fabs(theta_dual) <= dual_feasibility_tolerance;
  const bool theta_dual_sign_error =
      updated_theta_dual * computed_theta_dual <= 0;

  // If theta_dual is small, then it's no longer a dual infeasibility,
  // so reduce the number of dual infeasibilities. Otherwise an error
  // is identified in debugSimplex
  if (theta_dual_small) ekk_instance_.info_.num_dual_infeasibilities--;
  if (theta_dual_small || theta_dual_sign_error) {
    // The computed dual is small or has a sign error, so don't use it
    std::string theta_dual_size = "";
    if (theta_dual_small) theta_dual_size = "; too small";
    std::string theta_dual_sign = "";
    if (theta_dual_sign_error) theta_dual_sign = "; sign error";
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "Chosen entering variable %" HIGHSINT_FORMAT
                " (Iter = %" HIGHSINT_FORMAT "; Update = %" HIGHSINT_FORMAT
                ") has computed "
                "(updated) dual of %10.4g (%10.4g) so don't use it%s%s\n",
                variable_in, ekk_instance_.iteration_count_, info.update_count,
                computed_theta_dual, updated_theta_dual,
                theta_dual_size.c_str(), theta_dual_sign.c_str());
    // If a significant computed dual has sign error, consider reinverting
    if (!theta_dual_small && info.update_count > 0)
      rebuild_reason = kRebuildReasonPossiblySingularBasis;
    hyperChooseColumnClear();
    return false;
  }
  return true;
}